

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O0

uint8 * __thiscall
sentencepiece::ModelProto::_InternalSerialize
          (ModelProto *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  uint32 uVar2;
  int size;
  uint8 *puVar3;
  ModelProto_SentencePiece *this_00;
  TrainerSpec *this_01;
  NormalizerSpec *pNVar4;
  SelfTestData *this_02;
  InternalMetadata *pIVar5;
  void *data;
  uint local_1d8;
  uint n;
  uint i;
  uint32 cached_has_bits;
  EpsCopyOutputStream *stream_local;
  uint8 *target_local;
  ModelProto *this_local;
  
  local_1d8 = 0;
  uVar1 = _internal_pieces_size(this);
  stream_local = (EpsCopyOutputStream *)target;
  for (; local_1d8 < uVar1; local_1d8 = local_1d8 + 1) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8 *)stream_local);
    this_00 = _internal_pieces(this,local_1d8);
    uVar2 = google::protobuf::internal::WireFormatLite::MakeTag(1,WIRETYPE_LENGTH_DELIMITED);
    puVar3 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(uVar2,puVar3);
    uVar2 = ModelProto_SentencePiece::GetCachedSize(this_00);
    puVar3 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(uVar2,puVar3);
    stream_local = (EpsCopyOutputStream *)
                   ModelProto_SentencePiece::_InternalSerialize(this_00,puVar3,stream);
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8 *)stream_local);
    this_01 = _Internal::trainer_spec(this);
    uVar2 = google::protobuf::internal::WireFormatLite::MakeTag(2,WIRETYPE_LENGTH_DELIMITED);
    puVar3 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(uVar2,puVar3);
    uVar2 = TrainerSpec::GetCachedSize(this_01);
    puVar3 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(uVar2,puVar3);
    stream_local = (EpsCopyOutputStream *)TrainerSpec::_InternalSerialize(this_01,puVar3,stream);
  }
  if ((uVar1 & 2) != 0) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8 *)stream_local);
    pNVar4 = _Internal::normalizer_spec(this);
    uVar2 = google::protobuf::internal::WireFormatLite::MakeTag(3,WIRETYPE_LENGTH_DELIMITED);
    puVar3 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(uVar2,puVar3);
    uVar2 = NormalizerSpec::GetCachedSize(pNVar4);
    puVar3 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(uVar2,puVar3);
    stream_local = (EpsCopyOutputStream *)NormalizerSpec::_InternalSerialize(pNVar4,puVar3,stream);
  }
  if ((uVar1 & 4) != 0) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8 *)stream_local);
    this_02 = _Internal::self_test_data(this);
    uVar2 = google::protobuf::internal::WireFormatLite::MakeTag(4,WIRETYPE_LENGTH_DELIMITED);
    puVar3 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(uVar2,puVar3);
    uVar2 = SelfTestData::GetCachedSize(this_02);
    puVar3 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(uVar2,puVar3);
    stream_local = (EpsCopyOutputStream *)SelfTestData::_InternalSerialize(this_02,puVar3,stream);
  }
  if ((uVar1 & 8) != 0) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8 *)stream_local);
    pNVar4 = _Internal::denormalizer_spec(this);
    uVar2 = google::protobuf::internal::WireFormatLite::MakeTag(5,WIRETYPE_LENGTH_DELIMITED);
    puVar3 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(uVar2,puVar3);
    uVar2 = NormalizerSpec::GetCachedSize(pNVar4);
    puVar3 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(uVar2,puVar3);
    stream_local = (EpsCopyOutputStream *)NormalizerSpec::_InternalSerialize(pNVar4,puVar3,stream);
  }
  stream_local = (EpsCopyOutputStream *)
                 google::protobuf::internal::ExtensionSet::_InternalSerialize
                           (&this->_extensions_,200,0x20000000,(uint8 *)stream_local,stream);
  if (((uint)(this->super_MessageLite)._internal_metadata_.ptr_ & 1) == 1) {
    pIVar5 = &(this->super_MessageLite)._internal_metadata_;
    if (((uint)pIVar5->ptr_ & 1) == 1) {
      google::protobuf::internal::InternalMetadata::
      PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
                (pIVar5);
    }
    else {
      google::protobuf::internal::GetEmptyString_abi_cxx11_();
    }
    data = (void *)std::__cxx11::string::data();
    pIVar5 = &(this->super_MessageLite)._internal_metadata_;
    if (((uint)pIVar5->ptr_ & 1) == 1) {
      google::protobuf::internal::InternalMetadata::
      PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
                (pIVar5);
    }
    else {
      google::protobuf::internal::GetEmptyString_abi_cxx11_();
    }
    size = std::__cxx11::string::size();
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRaw
                             (stream,data,size,(uint8 *)stream_local);
  }
  return (uint8 *)stream_local;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* ModelProto::_InternalSerialize(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:sentencepiece.ModelProto)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .sentencepiece.ModelProto.SentencePiece pieces = 1;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_pieces_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(1, this->_internal_pieces(i), target, stream);
  }

  cached_has_bits = _has_bits_[0];
  // optional .sentencepiece.TrainerSpec trainer_spec = 2;
  if (cached_has_bits & 0x00000001u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        2, _Internal::trainer_spec(this), target, stream);
  }

  // optional .sentencepiece.NormalizerSpec normalizer_spec = 3;
  if (cached_has_bits & 0x00000002u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        3, _Internal::normalizer_spec(this), target, stream);
  }

  // optional .sentencepiece.SelfTestData self_test_data = 4;
  if (cached_has_bits & 0x00000004u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        4, _Internal::self_test_data(this), target, stream);
  }

  // optional .sentencepiece.NormalizerSpec denormalizer_spec = 5;
  if (cached_has_bits & 0x00000008u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        5, _Internal::denormalizer_spec(this), target, stream);
  }

  // Extension range [200, 536870912)
  target = _extensions_._InternalSerialize(
      200, 536870912, target, stream);

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:sentencepiece.ModelProto)
  return target;
}